

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool erlang_check(double param_1,double b,int c)

{
  char *pcVar1;
  
  if (b <= 0.0) {
    pcVar1 = "  B <= 0.0\n";
  }
  else {
    if (0 < c) {
      return true;
    }
    pcVar1 = "  C <= 0.\n";
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"ERLANG_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,pcVar1);
  return false;
}

Assistant:

bool erlang_check ( double /*a*/, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    ERLANG_CHECK checks the parameters of the Erlang PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, int C, the parameters of the PDF.
//    0.0 < B.
//    0 < C.
//
//    Output, bool ERLANG_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "ERLANG_CHECK - Warning!\n";
    cerr << "  B <= 0.0\n";
    return false;
  }

  if ( c <= 0 )
  {
    cerr << " \n";
    cerr << "ERLANG_CHECK - Warning!\n";
    cerr << "  C <= 0.\n";
    return false;
  }

  return true;
}